

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::LoopLayerParams::MergePartialFromCodedStream
          (LoopLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  NeuralNetwork *value;
  string *psVar5;
  char cVar6;
  ulong uVar7;
  
LAB_001c02c8:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_001c02eb;
    input->buffer_ = pbVar2 + 1;
    uVar7 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_001c02eb:
    uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar7 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar7 = 0x100000000;
    }
    uVar7 = uVar4 | uVar7;
  }
  uVar4 = (uint32)uVar7;
  if ((uVar7 & 0x100000000) == 0) goto switchD_001c0349_default;
  cVar6 = (char)uVar7;
  switch((uint)(uVar7 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar6 != '\b') break;
    bVar3 = google::protobuf::io::CodedInputStream::ReadVarint64(input,&this->maxloopiterations_);
    goto LAB_001c032d;
  case 2:
    if (cVar6 != '\x12') break;
    psVar5 = mutable_conditionvar_abi_cxx11_(this);
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar5);
    if (!bVar3) {
      return false;
    }
    psVar5 = (this->conditionvar_).ptr_;
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,PARSE,
                       "CoreML.Specification.LoopLayerParams.conditionVar");
    if (!bVar3) {
      return false;
    }
    goto LAB_001c02c8;
  case 3:
    if (cVar6 == '\x1a') {
      value = mutable_conditionnetwork(this);
LAB_001c037c:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::NeuralNetwork>(input,value);
      goto LAB_001c032d;
    }
    break;
  case 4:
    if (cVar6 == '\"') {
      value = mutable_bodynetwork(this);
      goto LAB_001c037c;
    }
  }
switchD_001c0349_default:
  if (uVar4 == 0) {
    return true;
  }
  if ((uVar4 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_001c032d:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_001c02c8;
}

Assistant:

bool LoopLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LoopLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 maxLoopIterations = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &maxloopiterations_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string conditionVar = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_conditionvar()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->conditionvar().data(), this->conditionvar().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LoopLayerParams.conditionVar"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_conditionnetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bodynetwork()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LoopLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LoopLayerParams)
  return false;
#undef DO_
}